

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psvimg-create.c
# Opt level: O2

int main(int argc,char **argv)

{
  char *pcVar1;
  int iVar2;
  time_t tVar3;
  ulong uVar4;
  size_t sVar5;
  char *pcVar6;
  int i;
  long lVar7;
  size_t sStack_630;
  int fds [4];
  pthread_t pth2;
  pthread_t pth1;
  args_t args1;
  args_t args2;
  PsvMd_t md;
  stat st;
  char path [1024];
  
  if (argc < 7) {
    fwrite("usage: psvimg-create [-m metadata|-n name] [-A aid | -K key] inputdir outputdir\n",0x50,
           1,_stderr);
    fwrite("  specify either a decrypted metadata file as a template or\n",0x3c,1,_stderr);
    pcVar6 = "  a name and other metadata fields will retain default values\n";
    sStack_630 = 0x3e;
    goto LAB_00102471;
  }
  pcVar6 = argv[1];
  if (*pcVar6 == '-') {
    if ((pcVar6[1] == 'm') && (pcVar6[2] == '\0')) {
      iVar2 = open(argv[2],0);
      if (iVar2 < 0) {
        pcVar6 = "metadata\n";
        sStack_630 = 9;
        goto LAB_00102471;
      }
      uVar4 = read_block(iVar2,&md,0xa8);
      if (uVar4 < 0xa8) {
        pcVar6 = "invalid metadata size\n";
        sStack_630 = 0x16;
        goto LAB_00102471;
      }
      if (md.type != 2) {
        pcVar6 = "metadata type not supported\n";
        sStack_630 = 0x1c;
LAB_0010250c:
        fwrite(pcVar6,sStack_630,1,_stderr);
        close(iVar2);
        return 1;
      }
      uVar4 = read_block(iVar2,&md.add_data,4);
      if (uVar4 < 4) {
        pcVar6 = "invalid metadata size\n";
        sStack_630 = 0x16;
        goto LAB_0010250c;
      }
      close(iVar2);
    }
    else {
      if ((pcVar6[1] != 'n') || (pcVar6[2] != '\0')) goto LAB_0010245a;
      memset(&md,0,0xac);
      strncpy(md.name,argv[2],0x40);
      iVar2 = is_backup(md.name);
      md.magic = 0xfee1900e - (iVar2 == 0);
      md.type = 2;
      md.version = 2;
      md.add_data = 1;
      tVar3 = time((time_t *)0x0);
      srand((uint)tVar3);
      for (lVar7 = 0; lVar7 != 0x10; lVar7 = lVar7 + 1) {
        iVar2 = rand();
        md.iv[lVar7] = (uint8_t)(iVar2 % 0xff);
      }
    }
    iVar2 = pipe(fds);
    if (iVar2 < 0) {
      pcVar6 = "pipe 1\n";
LAB_00102545:
      sStack_630 = 7;
      goto LAB_00102471;
    }
    args1.in = 0;
    args1.prefix = argv[5];
    args1.content_size = 0;
    args1.out = fds[1];
    iVar2 = stat(argv[6],(stat *)&st);
    if (iVar2 < 0) {
      mkdir(argv[6],0x1c0);
    }
    pcVar6 = md.name;
    snprintf(path,0x400,"%s/%s.psvimg",argv[6],pcVar6);
    args2.out = open(path,0x241,0x1a4);
    if (args2.out < 0) {
      pcVar6 = "psvimg output\n";
      sStack_630 = 0xe;
      goto LAB_00102471;
    }
    args2.in = fds[0];
    pcVar1 = argv[3];
    if (*pcVar1 == '-') {
      if ((pcVar1[1] == 'K') && (pcVar1[2] == '\0')) {
        iVar2 = parse_key(argv[4],args2.key);
        if (-1 < iVar2) {
LAB_00102679:
          args2.iv[0] = md.iv[0];
          args2.iv[1] = md.iv[1];
          args2.iv[2] = md.iv[2];
          args2.iv[3] = md.iv[3];
          args2.iv[4] = md.iv[4];
          args2.iv[5] = md.iv[5];
          args2.iv[6] = md.iv[6];
          args2.iv[7] = md.iv[7];
          args2.iv[8] = md.iv[8];
          args2.iv[9] = md.iv[9];
          args2.iv[10] = md.iv[10];
          args2.iv[0xb] = md.iv[0xb];
          args2.iv[0xc] = md.iv[0xc];
          args2.iv[0xd] = md.iv[0xd];
          args2.iv[0xe] = md.iv[0xe];
          args2.iv[0xf] = md.iv[0xf];
          pthread_create(&pth1,(pthread_attr_t *)0x0,encrypt_thread,&args2);
          pthread_create(&pth2,(pthread_attr_t *)0x0,pack_thread,&args1);
          pthread_join(pth2,(void **)0x0);
          pthread_join(pth1,(void **)0x0);
          iVar2 = stat(path,(stat *)&st);
          if (iVar2 < 0) {
            pcVar6 = "stat\n";
            sStack_630 = 5;
            goto LAB_00102471;
          }
          fprintf(_stderr,"created %s (size: %llx, content size: %zx)\n",path,st.st_size,
                  args1.content_size);
          md.total_size = args1.content_size;
          md.psvimg_size = st.st_size;
          snprintf(path,0x400,"%s/%s.psvmd",argv[6],pcVar6);
          iVar2 = pipe(fds);
          if (iVar2 < 0) {
            pcVar6 = "pipe 2\n";
          }
          else {
            iVar2 = pipe(fds + 2);
            if (-1 < iVar2) {
              args1.in = fds[0];
              args1.out = fds[3];
              args2.in = fds[2];
              args2.out = open(path,0x241,0x1a4);
              if (-1 < args2.out) {
                for (lVar7 = 0x28; lVar7 != 0x38; lVar7 = lVar7 + 1) {
                  iVar2 = rand();
                  args2.key[lVar7 + -8] = (uchar)(iVar2 % 0xff);
                }
                pthread_create(&pth1,(pthread_attr_t *)0x0,encrypt_thread,&args2);
                pthread_create(&pth2,(pthread_attr_t *)0x0,compress_thread,&args1);
                write_block(fds[1],&md,0xac);
                close(fds[1]);
                pthread_join(pth2,(void **)0x0);
                pthread_join(pth1,(void **)0x0);
                fprintf(_stderr,"created %s\n",path);
                iVar2 = is_backup(pcVar6);
                if (iVar2 != 0) {
                  snprintf(path,0x400,"%s/%s.psvinf",argv[6],pcVar6);
                  iVar2 = open(path,0x241,0x1a4);
                  sVar5 = strnlen(pcVar6,0x40);
                  write_block(iVar2,pcVar6,sVar5 + 1);
                  close(iVar2);
                  fprintf(_stderr,"created %s\n",path);
                  return 0;
                }
                return 0;
              }
              pcVar6 = "psvmd output\n";
              sStack_630 = 0xd;
              goto LAB_00102471;
            }
            pcVar6 = "pipe 3\n";
          }
          goto LAB_00102545;
        }
        pcVar6 = "invalid key\n";
      }
      else {
        if ((pcVar1[1] != 'A') || (pcVar1[2] != '\0')) goto LAB_00102663;
        iVar2 = generate_key_from_aid(argv[4],args2.key);
        if (-1 < iVar2) goto LAB_00102679;
        pcVar6 = "invalid aid\n";
      }
      sStack_630 = 0xc;
      goto LAB_00102471;
    }
LAB_00102663:
    pcVar6 = "you must specify either -A or -K!\n";
  }
  else {
LAB_0010245a:
    pcVar6 = "you must specify either -m or -n!\n";
  }
  sStack_630 = 0x22;
LAB_00102471:
  fwrite(pcVar6,sStack_630,1,_stderr);
  return 1;
}

Assistant:

int main(int argc, const char *argv[]) {
  args_t args1, args2;
  struct stat st;
  int fds[4];
  char path[MAX_PATH_LEN];
  int mfd;
  PsvMd_t md;
  pthread_t pth1, pth2;

  if (argc < 7) {
    fprintf(stderr, "usage: psvimg-create [-m metadata|-n name] [-A aid | -K key] inputdir outputdir\n");
    fprintf(stderr, "  specify either a decrypted metadata file as a template or\n");
    fprintf(stderr, "  a name and other metadata fields will retain default values\n");
    return 1;
  }

  // TODO: support more types
  if (strcmp(argv[1], "-m") == 0) {
    mfd = open(argv[2], O_RDONLY | O_BINARY);
    if (mfd < 0) {
      fprintf(stderr, "metadata\n");
      return 1;
    }
    if (read_block(mfd, &md, sizeof(md) - sizeof(md.add_data)) < sizeof(md) - sizeof(md.add_data)) {
      fprintf(stderr, "invalid metadata size\n");
      return 1;
    }
    if (md.type != 2) {
      fprintf(stderr, "metadata type not supported\n");
      close(mfd);
      return 1;
    }
    if (read_block(mfd, &md.add_data, sizeof(md.add_data)) < sizeof(md.add_data)) {
      fprintf(stderr, "invalid metadata size\n");
      close(mfd);
      return 1;
    }
    close(mfd);
  } else if (strcmp(argv[1], "-n") == 0) {
    memset(&md, 0, sizeof(md));
    strncpy(md.name, argv[2], sizeof(md.name));
    md.magic = is_backup(md.name) ? PSVMD_BACKUP_MAGIC : PSVMD_CONTENT_MAGIC;
    md.type = 2;
    md.version = 2;
    md.add_data = 1;
    srand(time(NULL));
    for (int i = 0; i < sizeof(md.iv); i++) {
      md.iv[i] = rand() % 0xFF;
    }
  } else {
    fprintf(stderr, "you must specify either -m or -n!\n");
    return 1;
  }

  if (pipe(fds) < 0) {
    fprintf(stderr, "pipe 1\n");
    return 1;
  }

  args1.in = 0;
  args1.prefix = argv[5];
  args1.content_size = 0;
  args1.out = fds[1];

  if (stat(argv[6], &st) < 0) {
    mkdir(argv[6], 0700);
  }

  snprintf(path, sizeof(path), "%s/%s.psvimg", argv[6], md.name);

  args2.out = open(path, O_WRONLY | O_CREAT | O_BINARY | O_TRUNC, 0644);
  if (args2.out < 0) {
    fprintf(stderr, "psvimg output\n");
    return 1;
  }
  args2.in = fds[0];

  if (strcmp(argv[3], "-K") == 0) {
    if (parse_key(argv[4], args2.key) < 0) {
      fprintf(stderr, "invalid key\n");
      return 1;
    }
  } else if (strcmp(argv[3], "-A") == 0) {
    if (generate_key_from_aid(argv[4], args2.key) < 0) {
      fprintf(stderr, "invalid aid\n");
      return 1;
    }
  } else {
    fprintf(stderr, "you must specify either -A or -K!\n");
    return 1;
  }

  memcpy(args2.iv, md.iv, sizeof(args2.iv));

  pthread_create(&pth1, NULL, encrypt_thread, &args2);
  pthread_create(&pth2, NULL, pack_thread, &args1);

  pthread_join(pth2, NULL);
  pthread_join(pth1, NULL);

  if (stat(path, &st) < 0) {
    fprintf(stderr, "stat\n");
    return 1;
  }
  fprintf(stderr, "created %s (size: %llx, content size: %zx)\n", path, st.st_size, args1.content_size);
  md.total_size = args1.content_size;
  md.psvimg_size = st.st_size;

  // now create the psvmd
  snprintf(path, sizeof(path), "%s/%s.psvmd", argv[6], md.name);

  if (pipe(fds) < 0) {
    fprintf(stderr, "pipe 2\n");
    return 1;
  }
  if (pipe(&fds[2]) < 0) {
    fprintf(stderr, "pipe 3\n");
    return 1;
  }

  args1.in = fds[0];
  args1.out = fds[3];

  args2.in = fds[2];
  args2.out = open(path, O_WRONLY | O_CREAT | O_BINARY | O_TRUNC, 0644);
  if (args2.out < 0) {
    fprintf(stderr, "psvmd output\n");
    return 1;
  }
  for (int i = 0; i < sizeof(md.iv); i++) {
    args2.iv[i] = rand() % 0xFF;
  }

  pthread_create(&pth1, NULL, encrypt_thread, &args2);
  pthread_create(&pth2, NULL, compress_thread, &args1);
  write_block(fds[1], &md, sizeof(md));
  close(fds[1]);

  pthread_join(pth2, NULL);
  pthread_join(pth1, NULL);

  
  fprintf(stderr, "created %s\n", path);

  // finally create the psvinf
  if (is_backup(md.name)) {
    snprintf(path, sizeof(path), "%s/%s.psvinf", argv[6], md.name);
    mfd = open(path, O_WRONLY | O_CREAT | O_BINARY | O_TRUNC, 0644);
    write_block(mfd, md.name, strnlen(md.name, 64) + 1);
    close(mfd);
    fprintf(stderr, "created %s\n", path);
  }

  return 0;
}